

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::IsDefaultArrayValuesFunction
               (RecyclableObject *function,ScriptContext *scriptContext)

{
  bool bVar1;
  FunctionProxy *this;
  JavascriptMethod p_Var2;
  JavascriptMethod p_Var3;
  ScriptFunction *local_40;
  JavascriptMethod method;
  ScriptFunction *scriptFunction;
  ScriptContext *scriptContext_local;
  RecyclableObject *function_local;
  
  bVar1 = ScriptContext::IsJsBuiltInEnabled(scriptContext);
  if (bVar1) {
    bVar1 = VarIs<Js::ScriptFunction,Js::RecyclableObject>(function);
    if (bVar1) {
      local_40 = UnsafeVarTo<Js::ScriptFunction,Js::RecyclableObject>(function);
    }
    else {
      local_40 = (ScriptFunction *)0x0;
    }
    if (local_40 != (ScriptFunction *)0x0) {
      EnsureBuiltInEngineIsReady(Array_prototype,scriptContext);
      this = ScriptFunction::GetFunctionProxy(local_40);
      bVar1 = FunctionProxy::IsJsBuiltInCode(this);
      return bVar1;
    }
  }
  p_Var2 = RecyclableObject::GetEntryPoint(function);
  p_Var3 = FunctionInfo::GetOriginalEntryPoint
                     ((FunctionInfo *)Js::JavascriptArray::EntryInfo::Values);
  return p_Var2 == p_Var3;
}

Assistant:

bool JavascriptLibrary::IsDefaultArrayValuesFunction(RecyclableObject * function, ScriptContext *scriptContext)
    {
#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            ScriptFunction * scriptFunction = JavascriptOperators::TryFromVar<ScriptFunction>(function);
            if (scriptFunction)
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
                return scriptFunction->GetFunctionProxy()->IsJsBuiltInCode();
            }
        }
#endif
        JavascriptMethod method = function->GetEntryPoint();
        return method == JavascriptArray::EntryInfo::Values.GetOriginalEntryPoint();
    }